

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

bool NULLC::IsDerivedFrom(NULLCRef derived,uint base)

{
  uint index;
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  NULLCRef *pNVar3;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),base);
  if ((pEVar1->typeFlags & 4) == 0) {
    pcVar2 = nullcGetTypeName(base);
    nullcThrowError("ERROR: type \'%s\' is not extendable",pcVar2);
  }
  pNVar3 = &derived;
  while (index = pNVar3->typeID, index != base) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),index);
    if (pEVar1->baseType == 0) break;
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),index);
    pNVar3 = (NULLCRef *)&pEVar1->baseType;
  }
  return index == base;
}

Assistant:

bool NULLC::IsDerivedFrom(NULLCRef derived, unsigned base)
{
	if((linker->exTypes[base].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) == 0)
		nullcThrowError("ERROR: type '%s' is not extendable", nullcGetTypeName(base));

	unsigned typeId = derived.typeID;

	for(;;)
	{
		if(base == typeId)
			return true;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	return false;
}